

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxdraw.c
# Opt level: O0

wchar_t nh_box_wborder(WINDOW *win,attr_t attrs)

{
  ushort uVar1;
  undefined8 in_stack_fffffffffffffe98;
  undefined4 uVar2;
  undefined8 in_stack_fffffffffffffea0;
  undefined4 uVar3;
  undefined8 in_stack_fffffffffffffea8;
  undefined4 uVar4;
  wchar_t local_144;
  wchar_t r;
  wchar_t tmp_7 [2];
  wchar_t tmp_6 [2];
  wchar_t tmp_5 [2];
  wchar_t tmp_4 [2];
  wchar_t tmp_3 [2];
  wchar_t tmp_2 [2];
  wchar_t tmp_1 [2];
  wchar_t tmp [2];
  cchar_t br;
  cchar_t bl;
  cchar_t tr;
  cchar_t tl;
  cchar_t bs;
  cchar_t ts;
  cchar_t rs;
  cchar_t ls;
  attr_t attrs_local;
  WINDOW *win_local;
  
  uVar4 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  uVar3 = (undefined4)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  uVar2 = (undefined4)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  if (box_draw_mode == L'\x01') {
    tmp_1[0] = box_chars[1][9];
    tmp_1[1] = L'\0';
    uVar1 = (ushort)(attrs >> 8);
    setcchar(rs.chars + 4,tmp_1,attrs,uVar1 & 0xff,0);
    tmp_2[0] = box_chars[box_draw_mode][9];
    tmp_2[1] = L'\0';
    setcchar(ts.chars + 4,tmp_2,attrs,uVar1 & 0xff,0);
    tmp_3[0] = box_chars[box_draw_mode][8];
    tmp_3[1] = L'\0';
    setcchar(bs.chars + 4,tmp_3,attrs,uVar1 & 0xff,0);
    tmp_4[0] = box_chars[box_draw_mode][8];
    tmp_4[1] = L'\0';
    setcchar(tl.chars + 4,tmp_4,attrs,uVar1 & 0xff,0);
    tmp_5[0] = box_chars[box_draw_mode][0];
    tmp_5[1] = L'\0';
    setcchar(tr.chars + 4,tmp_5,attrs,uVar1 & 0xff,0);
    tmp_6[0] = box_chars[box_draw_mode][2];
    tmp_6[1] = L'\0';
    setcchar(bl.chars + 4,tmp_6,attrs,uVar1 & 0xff,0);
    tmp_7[0] = box_chars[box_draw_mode][1];
    tmp_7[1] = L'\0';
    setcchar(br.chars + 4,tmp_7,attrs,uVar1 & 0xff,0);
    local_144 = box_chars[box_draw_mode][3];
    r = L'\0';
    setcchar(tmp,&local_144,attrs,uVar1 & 0xff,0);
    win_local._4_4_ =
         wborder_set(win,rs.chars + 4,ts.chars + 4,bs.chars + 4,tl.chars + 4,tr.chars + 4,
                     bl.chars + 4,br.chars + 4,tmp);
  }
  else {
    wattr_on(win,attrs,0);
    win_local._4_4_ =
         wborder(win,box_chars[box_draw_mode][9],box_chars[box_draw_mode][9],
                 box_chars[box_draw_mode][8],box_chars[box_draw_mode][8],box_chars[box_draw_mode][0]
                 ,CONCAT44(uVar2,box_chars[box_draw_mode][2]),
                 CONCAT44(uVar3,box_chars[box_draw_mode][1]),
                 CONCAT44(uVar4,box_chars[box_draw_mode][3]));
    wattr_off(win,attrs,0);
  }
  return win_local._4_4_;
}

Assistant:

int nh_box_wborder(WINDOW *win, attr_t attrs)
{
    if (box_draw_mode == 1) {
	cchar_t ls, rs, ts, bs, tl, tr, bl, br;
	NH_BOX_SETCCHAR(&ls, VLINE, attrs);
	NH_BOX_SETCCHAR(&rs, VLINE, attrs);
	NH_BOX_SETCCHAR(&ts, HLINE, attrs);
	NH_BOX_SETCCHAR(&bs, HLINE, attrs);
	NH_BOX_SETCCHAR(&tl, ULCORNER, attrs);
	NH_BOX_SETCCHAR(&tr, URCORNER, attrs);
	NH_BOX_SETCCHAR(&bl, LLCORNER, attrs);
	NH_BOX_SETCCHAR(&br, LRCORNER, attrs);
	return wborder_set(win, &ls, &rs, &ts, &bs, &tl, &tr, &bl, &br);

    } else {
	int r;
	wattron(win, attrs);
	r = wborder(win,
		      NH_BOX_CHAR(VLINE), NH_BOX_CHAR(VLINE),
		      NH_BOX_CHAR(HLINE), NH_BOX_CHAR(HLINE),
		      NH_BOX_CHAR(ULCORNER), NH_BOX_CHAR(URCORNER),
		      NH_BOX_CHAR(LLCORNER), NH_BOX_CHAR(LRCORNER));
	wattroff(win, attrs);
	return r;
    }
}